

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void jmp_append(FuncState *fs,BCPos *l1,BCPos l2)

{
  BCPos BVar1;
  BCPos in_EDX;
  FuncState *in_RSI;
  FuncState *in_RDI;
  BCPos next;
  BCPos list;
  BCPos pc;
  
  if (in_EDX != 0xffffffff) {
    if (*(int *)&in_RSI->kt == -1) {
      *(BCPos *)&in_RSI->kt = in_EDX;
    }
    else {
      BVar1 = *(BCPos *)&in_RSI->kt;
      do {
        pc = BVar1;
        BVar1 = jmp_next(in_RDI,pc);
      } while (BVar1 != 0xffffffff);
      jmp_patchins(in_RSI,in_EDX,pc);
    }
  }
  return;
}

Assistant:

static void jmp_append(FuncState *fs, BCPos *l1, BCPos l2)
{
  if (l2 == NO_JMP) {
    return;
  } else if (*l1 == NO_JMP) {
    *l1 = l2;
  } else {
    BCPos list = *l1;
    BCPos next;
    while ((next = jmp_next(fs, list)) != NO_JMP)  /* Find last element. */
      list = next;
    jmp_patchins(fs, list, l2);
  }
}